

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void createFallbackEdge(_GLFWwindow *window,_GLFWfallbackEdgeWayland *edge,wl_surface *parent,
                       wl_buffer *buffer,int x,int y,int width,int height)

{
  wl_surface *pwVar1;
  wl_subsurface *pwVar2;
  wp_viewport *pwVar3;
  wl_region *wl_region;
  wl_region *region;
  int y_local;
  int x_local;
  wl_buffer *buffer_local;
  wl_surface *parent_local;
  _GLFWfallbackEdgeWayland *edge_local;
  _GLFWwindow *window_local;
  
  pwVar1 = wl_compositor_create_surface(_glfw.wl.compositor);
  edge->surface = pwVar1;
  wl_surface_set_user_data(edge->surface,window);
  (*_glfw.wl.client.proxy_set_tag)((wl_proxy *)edge->surface,(char **)0x18e040);
  pwVar2 = wl_subcompositor_get_subsurface(_glfw.wl.subcompositor,edge->surface,parent);
  edge->subsurface = pwVar2;
  wl_subsurface_set_position(edge->subsurface,x,y);
  pwVar3 = wp_viewporter_get_viewport(_glfw.wl.viewporter,edge->surface);
  edge->viewport = pwVar3;
  wp_viewport_set_destination(edge->viewport,width,height);
  wl_surface_attach(edge->surface,buffer,0,0);
  wl_region = wl_compositor_create_region(_glfw.wl.compositor);
  wl_region_add(wl_region,0,0,width,height);
  wl_surface_set_opaque_region(edge->surface,wl_region);
  wl_surface_commit(edge->surface);
  wl_region_destroy(wl_region);
  return;
}

Assistant:

static void createFallbackEdge(_GLFWwindow* window,
                               _GLFWfallbackEdgeWayland* edge,
                               struct wl_surface* parent,
                               struct wl_buffer* buffer,
                               int x, int y,
                               int width, int height)
{
    edge->surface = wl_compositor_create_surface(_glfw.wl.compositor);
    wl_surface_set_user_data(edge->surface, window);
    wl_proxy_set_tag((struct wl_proxy*) edge->surface, &_glfw.wl.tag);
    edge->subsurface = wl_subcompositor_get_subsurface(_glfw.wl.subcompositor,
                                                       edge->surface, parent);
    wl_subsurface_set_position(edge->subsurface, x, y);
    edge->viewport = wp_viewporter_get_viewport(_glfw.wl.viewporter,
                                                edge->surface);
    wp_viewport_set_destination(edge->viewport, width, height);
    wl_surface_attach(edge->surface, buffer, 0, 0);

    struct wl_region* region = wl_compositor_create_region(_glfw.wl.compositor);
    wl_region_add(region, 0, 0, width, height);
    wl_surface_set_opaque_region(edge->surface, region);
    wl_surface_commit(edge->surface);
    wl_region_destroy(region);
}